

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall
Node::OutputDefinitionList(Node *this,ostream *os,Node *MainType,int ExtType,int GlobalStat)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  ostream *poVar4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [40];
  Node *loop;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [64];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [48];
  undefined1 local_48 [40];
  int GlobalStat_local;
  int ExtType_local;
  Node *MainType_local;
  ostream *os_local;
  Node *this_local;
  
  iVar1 = this->Type;
  local_240._32_8_ = this;
  local_48._32_4_ = GlobalStat;
  local_48._36_4_ = ExtType;
  _GlobalStat_local = MainType;
  MainType_local = (Node *)os;
  os_local = (ostream *)this;
  if (iVar1 == 0x112) {
    for (; pNVar3 = MainType_local, (Node *)local_240._32_8_ != (Node *)0x0;
        local_240._32_8_ = *(Node **)(local_240._32_8_ + 0x50)) {
      Indent_abi_cxx11_((Node *)local_240);
      poVar4 = std::operator<<((ostream *)pNVar3,(string *)local_240);
      poVar4 = std::operator<<(poVar4,"struct");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Indent_abi_cxx11_((Node *)local_260);
      poVar4 = std::operator<<(poVar4,(string *)local_260);
      poVar4 = std::operator<<(poVar4,"{");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::string::~string((string *)local_240);
      Level = Level + 1;
      OutputDefinitionList
                (((Node **)(local_240._32_8_ + 0x50))[1],(ostream *)MainType_local,_GlobalStat_local
                 ,local_48._36_4_,local_48._32_4_);
      pNVar3 = MainType_local;
      Level = Level + -1;
      Indent_abi_cxx11_((Node *)local_280);
      poVar4 = std::operator<<((ostream *)pNVar3,(string *)local_280);
      poVar4 = std::operator<<(poVar4,"};");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_280);
    }
  }
  else if (iVar1 == 0x124) {
    OutputDefinitionList(this->Tree[0],os,MainType,ExtType,GlobalStat);
    if (this->Block[0] != (Node *)0x0) {
      OutputDefinitionList
                (this->Block[0],(ostream *)MainType_local,_GlobalStat_local,local_48._36_4_,
                 local_48._32_4_);
    }
  }
  else if (iVar1 == 0x18a) {
    Indent_abi_cxx11_((Node *)local_2a0);
    std::operator<<(os,(string *)local_2a0);
    std::__cxx11::string::~string((string *)local_2a0);
    OutputRemark(this,(ostream *)MainType_local);
    if (this->Block[0] != (Node *)0x0) {
      OutputDefinitionList
                (this->Block[0],(ostream *)MainType_local,_GlobalStat_local,local_48._36_4_,
                 local_48._32_4_);
    }
  }
  else if (iVar1 == 0x1b4) {
    Indent_abi_cxx11_((Node *)local_1d8);
    poVar4 = std::operator<<(os,(string *)local_1d8);
    poVar4 = std::operator<<(poVar4,"union");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Indent_abi_cxx11_((Node *)local_1f8);
    poVar4 = std::operator<<(poVar4,(string *)local_1f8);
    poVar4 = std::operator<<(poVar4,"{");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1d8);
    Level = Level + 1;
    OutputDefinitionList
              (this->Block[1],(ostream *)MainType_local,_GlobalStat_local,local_48._36_4_,
               local_48._32_4_);
    pNVar3 = MainType_local;
    Level = Level + -1;
    Indent_abi_cxx11_((Node *)&loop);
    poVar4 = std::operator<<((ostream *)pNVar3,(string *)&loop);
    poVar4 = std::operator<<(poVar4,"};");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&loop);
  }
  else if (iVar1 == 0x1d8) {
    Indent_abi_cxx11_((Node *)local_48);
    std::operator<<(os,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    if (local_48._32_4_ == 1) {
      std::operator<<((ostream *)MainType_local,"const ");
    }
    else if (local_48._32_4_ == 3) {
      std::operator<<((ostream *)MainType_local,"extern const ");
    }
    else if (local_48._32_4_ == 4) {
      std::operator<<((ostream *)MainType_local,"extern ");
    }
    pNVar3 = MainType_local;
    if (this->Tree[2] == (Node *)0x0) {
      if (this->Tree[1] != (Node *)0x0) {
        OutputNodeVarType_abi_cxx11_((Node *)local_b8);
        poVar4 = std::operator<<((ostream *)pNVar3,(string *)local_b8);
        std::operator<<(poVar4," ");
        std::__cxx11::string::~string((string *)local_b8);
      }
      pNVar3 = MainType_local;
      if (this->Tree[3] != (Node *)0x0) {
        OutputPassmech_abi_cxx11_((Node *)local_d8,(int)this->Tree[3]);
        std::operator<<((ostream *)pNVar3,(string *)local_d8);
        std::__cxx11::string::~string((string *)local_d8);
      }
      pNVar3 = MainType_local;
      if (this->Tree[0] != (Node *)0x0) {
        OutputVarName_abi_cxx11_((Node *)local_f8,this->Tree[0],(int)this->Tree[2]);
        std::operator<<((ostream *)pNVar3,(string *)local_f8);
        std::__cxx11::string::~string((string *)local_f8);
      }
      pNVar3 = MainType_local;
      if (this->Tree[4] == (Node *)0x0) {
        pNVar2 = this->Tree[2];
        GetNodeVarType(this->Tree[1]);
        OutputVarInit_abi_cxx11_((int)(string *)(local_158 + 0x20),(uint)(pNVar2 != (Node *)0x0));
        std::operator<<((ostream *)pNVar3,(string *)(local_158 + 0x20));
        std::__cxx11::string::~string((string *)(local_158 + 0x20));
      }
      else {
        poVar4 = std::operator<<((ostream *)MainType_local," = ");
        Expression_abi_cxx11_((Node *)local_118);
        std::operator<<(poVar4,(string *)local_118);
        std::__cxx11::string::~string((string *)local_118);
      }
    }
    else {
      OutputArrayDef_abi_cxx11_((Node *)local_78,this->Tree[2]);
      poVar4 = std::operator<<((ostream *)pNVar3,(string *)local_78);
      poVar4 = std::operator<<(poVar4," ");
      OutputVarName_abi_cxx11_((Node *)local_98,this->Tree[0],(int)this->Tree[2]);
      std::operator<<(poVar4,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_78);
    }
    poVar4 = std::operator<<((ostream *)MainType_local,";");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (this->Block[0] != (Node *)0x0) {
      OutputDefinitionList
                (this->Block[0],(ostream *)MainType_local,_GlobalStat_local,local_48._36_4_,
                 local_48._32_4_);
    }
  }
  else if ((iVar1 == 0x1d9) || (iVar1 - 0x1fdU < 2)) {
    Indent_abi_cxx11_((Node *)local_158);
    std::operator<<(os,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
    if (local_48._32_4_ == 2) {
      std::operator<<((ostream *)MainType_local,"extern ");
    }
    pNVar3 = MainType_local;
    if (this->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_((Node *)local_178);
      poVar4 = std::operator<<((ostream *)pNVar3,(string *)local_178);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)local_178);
    }
    pNVar3 = MainType_local;
    if (this->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_((Node *)local_198,(int)this->Tree[3]);
      std::operator<<((ostream *)pNVar3,(string *)local_198);
      std::__cxx11::string::~string((string *)local_198);
    }
    pNVar3 = MainType_local;
    OutputVarName_abi_cxx11_((Node *)local_1b8,this->Tree[0],(int)this->Tree[2]);
    std::operator<<((ostream *)pNVar3,(string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    if (this->Tree[4] != (Node *)0x0) {
      std::operator<<((ostream *)MainType_local," = ");
      OutputCodeOne(this->Tree[4],(ostream *)MainType_local);
    }
    poVar4 = std::operator<<((ostream *)MainType_local,";");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (this->Block[0] != (Node *)0x0) {
      OutputDefinitionList
                (this->Block[0],(ostream *)MainType_local,_GlobalStat_local,local_48._36_4_,
                 local_48._32_4_);
    }
  }
  else {
    Indent_abi_cxx11_((Node *)local_2c0);
    poVar4 = std::operator<<(os,(string *)local_2c0);
    OutputDefinition_abi_cxx11_((Node *)local_2e0,this,(int)_GlobalStat_local);
    poVar4 = std::operator<<(poVar4,(string *)local_2e0);
    poVar4 = std::operator<<(poVar4,";");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)local_2c0);
  }
  return;
}

Assistant:

void Node::OutputDefinitionList(
	std::ostream& os,	/**< iostream to write C++ code to */
	Node* MainType,		/**< main data type */
	int ExtType,		/**< extended data type */
	int GlobalStat		/**< global status */
)
{
	switch(Type)
	{
	case BAS_S_DECLARE:
		Tree[0]->OutputDefinitionList(os,
			MainType, ExtType, GlobalStat);
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os,
				MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEVAR:
		os << Indent();

		switch(GlobalStat)
		{
		case 1:		// Constant definition
			os << "const ";
			break;

		case 3:		// External constant
			os << "extern const ";
			break;

		case 4:		// External
			os << "extern ";
			break;
		}

		//
		// We have an array
		//
		if (Tree[2] != 0)
		{
			os << Tree[2]->OutputArrayDef(this) << " " <<
				Tree[0]->OutputVarName(Tree[2], 1 + 2);
		}
		else
		{
			if (Tree[1] != 0)
			{
				os << Tree[1]->OutputNodeVarType() << " ";
			}
			if (Tree[3] != 0)
			{
				os << Tree[3]->OutputPassmech(0);
			}
			if (Tree[0] != 0)
			{
				os << Tree[0]->OutputVarName(Tree[2], 1);
			}
			if (Tree[4] != 0)
			{
				os << " = " << Tree[4]->Expression();
			}
			else
			{
				os << OutputVarInit(
					Tree[2] != 0,
					Tree[1]->GetNodeVarType());
			}
		}

		os << ";" << std::endl;

//
// For these definitions, a downlink points to the next variable 
// not to internal structures of this variable.
// So, is this needed by anything?
// 
// This is apparently used by DIM statements when multu=iplw variables
// are dimensioned.
//
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEFUN:
	case BAS_N_EXTERNALFUNCTION:
	case BAS_N_EXTERNALSUB:
		os << Indent();

		switch(GlobalStat)
		{
		case 2:		// Constant definition
			os << "extern ";
			break;
		}

		if (Tree[1] != 0)
		{
			os << Tree[1]->OutputNodeVarType() << " ";
		}
		if (Tree[3] != 0)
		{
			os << Tree[3]->OutputPassmech(1);
		}
		os << Tree[0]->OutputVarName(Tree[2], 1);
		if (Tree[4] != 0)
		{
			os << " = ";
			Tree[4]->OutputCodeOne(os);
		}
		os << ";" << std::endl;
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_S_VARIANT:

		os << Indent() << "union" << std::endl <<
			Indent() << "{" << std::endl;
		Level++;
		Block[1]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		Level--;
		os << Indent() << "};" << std::endl;

		break;

	case BAS_S_CASE:
		//
		// Variant case
		//
		for (Node* loop = this; loop != 0; loop = loop->Block[0])
		{
			os << Indent() << "struct" << std::endl <<
				Indent() << "{" << std::endl;
			Level++;
			loop->Block[1]->OutputDefinitionList(os, MainType, ExtType,
				GlobalStat);
			Level--;
			os << Indent() << "};" << std::endl;
		}

		break;


	case BAS_S_REMARK:
		os << Indent();
		OutputRemark(os);
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	default:
		os << Indent() << OutputDefinition(MainType, ExtType) << ";" << std::endl;
		break;
	}
}